

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O2

int __thiscall Player::fortify(Player *this)

{
  Country *this_00;
  bool bVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  ostream *poVar5;
  reference ppCVar6;
  pointer ppCVar7;
  pointer ppCVar8;
  ulong uVar9;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *pvVar10;
  string local_68;
  _Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_> local_48;
  
  setPlayerState(this,FORTIFYING);
  notifyAll(this);
  PlayerStrategy::getStrategyName_abi_cxx11_(&local_68,this->strategy);
  bVar1 = std::operator==(&local_68,"CHEATER");
  std::__cxx11::string::~string((string *)&local_68);
  if (bVar1) {
    iVar2 = (**this->strategy->_vptr_PlayerStrategy)(this->strategy,6);
    return (int)(char)iVar2;
  }
  while( true ) {
    std::ios::clear((int)*(undefined8 *)(std::cin + -0x18) + 0x13d520);
    poVar5 = std::operator<<((ostream *)&std::cout,"\n[PLAYER ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,*this->pPlayerId);
    std::operator<<(poVar5,"] Do you wish to fortify a country this turn (y/n)? ");
    uVar3 = (**this->strategy->_vptr_PlayerStrategy)(this->strategy,6);
    if ((char)uVar3 == 'n') break;
    if ((uVar3 & 0xff) == 0x79) {
      poVar5 = std::operator<<((ostream *)&std::cout,"\nPlayer ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,*this->pPlayerId);
      poVar5 = std::operator<<(poVar5," has chosen to fortify!");
      std::endl<char,std::char_traits<char>>(poVar5);
      iVar2 = 10;
      goto LAB_0010be5f;
    }
    std::operator<<((ostream *)&std::cout,"\nInvalid input. Try again.\n");
  }
  poVar5 = std::operator<<((ostream *)&std::cout,"\nPlayer ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,*this->pPlayerId);
  poVar5 = std::operator<<(poVar5," has chosen NOT to fortify!");
  std::endl<char,std::char_traits<char>>(poVar5);
LAB_0010bfd7:
  setPlayerState(this,IDLE);
  (*this->strategy->_vptr_PlayerStrategy[5])();
  return 0;
  while( true ) {
    pvVar10 = this->pOwnedCountries;
    uVar9 = (ulong)uVar3;
    if (((int)((ulong)((long)(pvVar10->
                             super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>).
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)(pvVar10->
                            super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>).
                            _M_impl.super__Vector_impl_data._M_start) >> 3) <= (int)uVar3) ||
       (ppCVar6 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::at(pvVar10,uVar9),
       *(*ppCVar6)->pNumberOfTroops < 2)) {
      std::operator<<((ostream *)&std::cout,"\nInvalid input. Try again.\n");
    }
    pvVar10 = this->pOwnedCountries;
    if (((int)uVar3 <
         (int)((ulong)((long)(pvVar10->
                             super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>).
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)(pvVar10->
                            super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>).
                            _M_impl.super__Vector_impl_data._M_start) >> 3)) &&
       (ppCVar6 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::at(pvVar10,uVar9),
       1 < *(*ppCVar6)->pNumberOfTroops)) break;
LAB_0010be5f:
    bVar1 = iVar2 == 0;
    iVar2 = iVar2 + -1;
    if (bVar1) {
      std::operator<<((ostream *)&std::cout,
                      "\nInvalid user input for 10 consecutive prompts, aborting action.\n");
      goto LAB_0010bfd7;
    }
    std::ios::clear((int)*(undefined8 *)(std::cin + -0x18) + 0x13d520);
    std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::vector
              ((vector<Map::Country_*,_std::allocator<Map::Country_*>_> *)&local_48,
               this->pOwnedCountries);
    showCountries((vector<Map::Country_*,_std::allocator<Map::Country_*>_> *)&local_48);
    std::_Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>::~_Vector_base(&local_48);
    poVar5 = std::operator<<((ostream *)&std::cout,"\nYou own ");
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    poVar5 = std::operator<<(poVar5,
                             " countries. Which country do you want to move armies from ? (choose 0 to "
                            );
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::operator<<(poVar5," ) ");
    uVar3 = (*this->strategy->_vptr_PlayerStrategy[1])(this->strategy,7);
    if ((int)uVar3 < 0) {
      std::operator<<((ostream *)&std::cout,"\nInvalid input. Try again.\n");
      goto LAB_0010be5f;
    }
  }
  ppCVar6 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::at
                      (this->pOwnedCountries,uVar9);
  this_00 = *ppCVar6;
  iVar2 = 10;
  do {
    while( true ) {
      bVar1 = iVar2 == 0;
      iVar2 = iVar2 + -1;
      if (bVar1) {
        std::operator<<((ostream *)&std::cout,
                        "\nInvalid user input for 10 consecutive prompts, aborting action.\n");
        return -1;
      }
      poVar5 = std::operator<<((ostream *)&std::cout,"\nCountry ");
      Map::Country::getCountryName_abi_cxx11_(&local_68,this_00);
      poVar5 = std::operator<<(poVar5,(string *)&local_68);
      poVar5 = std::operator<<(poVar5," has ");
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      poVar5 = std::operator<<(poVar5," neighbours");
      std::endl<char,std::char_traits<char>>(poVar5);
      std::__cxx11::string::~string((string *)&local_68);
      poVar5 = std::operator<<((ostream *)&std::cout,
                               "Which of YOUR countries would you like to move your armies to ? (0 to "
                              );
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      std::operator<<(poVar5,") ");
      uVar3 = (*this->strategy->_vptr_PlayerStrategy[1])(this->strategy,8);
      if (-1 < (int)uVar3) break;
      std::operator<<((ostream *)&std::cout,"\nInvalid input. Try again.\n");
    }
    pvVar10 = this_00->pAdjCountries;
    uVar9 = (ulong)uVar3;
    if ((int)uVar3 <
        (int)((ulong)((long)(pvVar10->
                            super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>).
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)(pvVar10->
                           super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>).
                           _M_impl.super__Vector_impl_data._M_start) >> 3)) {
      iVar4 = *this->pPlayerId;
      ppCVar6 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::at(pvVar10,uVar9);
      if (iVar4 != *(*ppCVar6)->pPlayerOwnerId) {
LAB_0010c259:
        poVar5 = std::operator<<((ostream *)&std::cout,
                                 "\nEither you don\'t own this country or the country has no neighbours.\n"
                                );
        poVar5 = std::operator<<(poVar5,"Skip turn.\n");
        std::endl<char,std::char_traits<char>>(poVar5);
        return -1;
      }
      pvVar10 = this_00->pAdjCountries;
      ppCVar8 = (pvVar10->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>).
                _M_impl.super__Vector_impl_data._M_start;
      ppCVar7 = (pvVar10->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>).
                _M_impl.super__Vector_impl_data._M_finish;
      if (ppCVar8 == ppCVar7) goto LAB_0010c259;
    }
    else {
      std::operator<<((ostream *)&std::cout,"\nInvalid input. Try again.\n");
      pvVar10 = this_00->pAdjCountries;
      ppCVar8 = (pvVar10->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>).
                _M_impl.super__Vector_impl_data._M_start;
      ppCVar7 = (pvVar10->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>).
                _M_impl.super__Vector_impl_data._M_finish;
    }
    if (((int)uVar3 < (int)((ulong)((long)ppCVar7 - (long)ppCVar8) >> 3)) &&
       (iVar4 = *this->pPlayerId,
       ppCVar6 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::at(pvVar10,uVar9),
       iVar4 == *(*ppCVar6)->pPlayerOwnerId)) {
      do {
        while( true ) {
          poVar5 = std::operator<<((ostream *)&std::cout,"\nYou have ");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,*this_00->pNumberOfTroops);
          poVar5 = std::operator<<(poVar5," armies in this country.");
          poVar5 = std::operator<<(poVar5," How many would you like to move ? (0 to ");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,*this_00->pNumberOfTroops + -1);
          std::operator<<(poVar5,") ");
          iVar2 = (*this->strategy->_vptr_PlayerStrategy[1])(this->strategy,9);
          if (-1 < iVar2) break;
          std::operator<<((ostream *)&std::cout,"\nInvalid input. Try again.\n");
        }
        iVar4 = *this_00->pNumberOfTroops;
        if (iVar4 <= iVar2) {
          std::operator<<((ostream *)&std::cout,"\nInvalid input. Try again.\n");
          iVar4 = *this_00->pNumberOfTroops;
        }
      } while (iVar4 <= iVar2);
      ppCVar6 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::at
                          (this_00->pAdjCountries,uVar9);
      executeFortify(this,this_00,*ppCVar6,iVar2);
      return 1;
    }
  } while( true );
}

Assistant:

int Player::fortify() {

    this->setPlayerState(PlayerState::FORTIFYING);
    this->notifyAll();
    if (this->getStrategy()->getStrategyName() == "CHEATER") {
        return (PlayerAction) this->getStrategy()->yesOrNo(StrategyContext::FORTIFY);
    }

    char playerChoice = 0;
    int fromCountryIndex = -1;
    int ctryToFortIndex = -1;
    int numArmies = -1;
    do {
        std::cin.clear();
        std::cout << "\n[PLAYER " << this->getPlayerId() << "] Do you wish to fortify a country this turn (y/n)? ";
        playerChoice = strategy->yesOrNo(StrategyContext::FORTIFY);
        if (playerChoice != 'y' && playerChoice != 'n') {
            std::cout << "\nInvalid input. Try again.\n";
            continue;
        }
    } while (playerChoice != 'y' && playerChoice != 'n');

    if (playerChoice == 'y') {
        std::cout << "\nPlayer " << this->getPlayerId() << " has chosen to fortify!" << std::endl;
        int failsafeCounter = 0;
        do {
            //avoid infinite loops in case of bot malfunction or human delaying the game
            if(failsafeCounter >= 10){
                std::cout << "\nInvalid user input for 10 consecutive prompts, aborting action.\n";
                this->setPlayerState(PlayerState::IDLE);
                this->strategy->resetChoices();
                return PlayerAction::ABORTED;
            }
            failsafeCounter++;

            std::cin.clear();
            showCountries(*this->getOwnedCountries());
            std::cout << "\nYou own " << this->getOwnedCountries()->size()
                      << " countries. Which country do you want to move armies from ? (choose 0 to "
                      << this->getOwnedCountries()->size() - 1 << " ) ";
            fromCountryIndex = strategy->intInput(StrategyContext::FORTIFY_FROM_COUNTRY);
            //new condition
            if (fromCountryIndex < 0 || fromCountryIndex > (int) this->getOwnedCountries()->size() - 1 ||
                this->getOwnedCountries()->at(fromCountryIndex)->getNumberOfTroops() <= 1) {
                std::cout << "\nInvalid input. Try again.\n";
                continue;
            }
            //new condition
        } while (fromCountryIndex < 0 || fromCountryIndex > (int) this->getOwnedCountries()->size() - 1 ||
                 this->getOwnedCountries()->at(fromCountryIndex)->getNumberOfTroops() <= 1);
    } else {
        std::cout << "\nPlayer " << this->getPlayerId() << " has chosen NOT to fortify!" << std::endl;
        this->setPlayerState(PlayerState::IDLE);
        this->strategy->resetChoices();
        return PlayerAction::ABORTED;
    }
    Map::Country *fromCountry = this->getOwnedCountries()->at(fromCountryIndex);
    int failsafeCounter = 0;
    do {
        //avoid infinite loops in case of bot malfunction or human delaying the game
        if(failsafeCounter >= 10){
            std::cout << "\nInvalid user input for 10 consecutive prompts, aborting action.\n";
            return -1;
        }
        failsafeCounter++;
        std::cout << "\nCountry " << fromCountry->getCountryName() << " has " << fromCountry->getAdjCountries()->size() << " neighbours" << std::endl;
        std::cout << "Which of YOUR countries would you like to move your armies to ? (0 to " << fromCountry->getAdjCountries()->size() - 1 << ") ";

        ctryToFortIndex = strategy->intInput(StrategyContext::FORTIFY_TO_COUNTRY);

        if (ctryToFortIndex < 0 || ctryToFortIndex > (int) fromCountry->getAdjCountries()->size() - 1) {
            std::cout << "\nInvalid input. Try again.\n";
            continue;
        }
        if (getPlayerId() != fromCountry->getAdjCountries()->at(ctryToFortIndex)->getPlayerOwnerID() ||
            fromCountry->getAdjCountries()->empty()) {
            std::cout << "\nEither you don't own this country or the country has no neighbours.\n"
                      << "Skip turn.\n" << std::endl;
            return -1;
        }
    } while (ctryToFortIndex < 0 || ctryToFortIndex > (int) fromCountry->getAdjCountries()->size() - 1 ||
             getPlayerId() != fromCountry->getAdjCountries()->at(ctryToFortIndex)->getPlayerOwnerID());

    do {
        std::cout << "\nYou have " << fromCountry->getNumberOfTroops() << " armies in this country."
                  << " How many would you like to move ? (0 to " << fromCountry->getNumberOfTroops() - 1 << ") ";
        numArmies = strategy->intInput(StrategyContext::FORTIFY_ARMY_COUNT);
        if (numArmies < 0 || numArmies > fromCountry->getNumberOfTroops() - 1) {
            std::cout << "\nInvalid input. Try again.\n";
            continue;
        }
    } while (numArmies < 0 || numArmies > fromCountry->getNumberOfTroops() - 1);

    Map::Country *countryToFortify = fromCountry->getAdjCountries()->at(ctryToFortIndex);

    return this->executeFortify(*fromCountry, *countryToFortify, numArmies);
}